

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChildKiller_impl.hpp
# Opt level: O2

void __thiscall
hiberlite::KillChildren::
act<hiberlite::AVisitor<hiberlite::KillChildren>,hiberlite::bean_ptr<B>,hiberlite::stl_stream_adapter<hiberlite::bean_ptr<B>,std::vector<hiberlite::bean_ptr<B>,std::allocator<hiberlite::bean_ptr<B>>>>>
          (KillChildren *this,AVisitor<hiberlite::KillChildren> *av,
          collection_nvp<hiberlite::bean_ptr<B>,_hiberlite::stl_stream_adapter<hiberlite::bean_ptr<B>,_std::vector<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>_>_>
          *nvp)

{
  AVisitor<hiberlite::KillChildren> *pAVar1;
  bean_ptr<B> *_value;
  _Elt_pointer plVar2;
  ulong uVar3;
  long lVar4;
  bean_ptr<B> *entry;
  vector<long_long,_std::allocator<long_long>_> children;
  string tab;
  sql_nvp<hiberlite::bean_ptr<B>_> el;
  allocator local_1f2;
  allocator local_1f1;
  KillChildren *local_1f0;
  AVisitor<hiberlite::KillChildren> *local_1e8;
  bean_ptr<B> *local_1e0;
  shared_connection local_1d8;
  shared_connection local_1c8;
  _Vector_base<long_long,_std::allocator<long_long>_> local_1b8;
  string local_1a0 [32];
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  Scope local_100;
  string local_b8;
  string local_98;
  sql_nvp<hiberlite::bean_ptr<B>_> local_78;
  
  local_1f0 = this;
  std::__cxx11::string::string((string *)&local_120,(string *)nvp);
  AVisitor<hiberlite::KillChildren>::diveTable(av,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  Scope::Scope(&local_100,&av->scope);
  std::__cxx11::string::string(local_1a0,(string *)&local_100);
  Scope::~Scope(&local_100);
  local_1c8._vptr_shared_res = (_func_int **)&PTR__shared_res_001bb598;
  local_1c8.res = (av->rootKey).con.res;
  if (local_1c8.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_1c8.res)->refCount = (local_1c8.res)->refCount + 1;
  }
  std::__cxx11::string::string((string *)&local_140,local_1a0);
  plVar2 = (local_1f0->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (plVar2 == (local_1f0->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    plVar2 = (local_1f0->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  local_1e8 = av;
  Database::dbSelectChildIds
            ((vector<long_long,_std::allocator<long_long>_> *)&local_1b8,&local_1c8,&local_140,
             plVar2[-1]);
  std::__cxx11::string::~string((string *)&local_140);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_1c8);
  lVar4 = 0;
  for (uVar3 = 0; pAVar1 = local_1e8,
      uVar3 < (ulong)((long)local_1b8._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_1b8._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar3 = uVar3 + 1) {
    access::construct<hiberlite::AVisitor<hiberlite::KillChildren>,hiberlite::bean_ptr<B>>
              (local_1e8,&local_1e0);
    std::deque<long_long,_std::allocator<long_long>_>::push_back
              ((deque<long_long,_std::allocator<long_long>_> *)local_1f0,
               (value_type_conflict4 *)
               ((long)local_1b8._M_impl.super__Vector_impl_data._M_start + lVar4));
    std::__cxx11::string::string((string *)&local_98,"item",&local_1f1);
    _value = local_1e0;
    std::__cxx11::string::string((string *)&local_b8,"",&local_1f2);
    sql_nvp<hiberlite::bean_ptr<B>_>::sql_nvp
              ((sql_nvp<hiberlite::bean_ptr<B>_> *)&local_100,&local_98,_value,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    sql_nvp<hiberlite::bean_ptr<B>_>::sql_nvp
              (&local_78,(sql_nvp<hiberlite::bean_ptr<B>_> *)&local_100);
    AVisitor<hiberlite::KillChildren>::operator&(local_1e8,&local_78);
    sql_nvp<hiberlite::bean_ptr<B>_>::~sql_nvp(&local_78);
    std::deque<long_long,_std::allocator<long_long>_>::pop_back
              ((deque<long_long,_std::allocator<long_long>_> *)local_1f0);
    if (local_1e0 != (bean_ptr<B> *)0x0) {
      (*(local_1e0->super_shared_res<hiberlite::real_bean<B>_>)._vptr_shared_res[1])();
    }
    sql_nvp<hiberlite::bean_ptr<B>_>::~sql_nvp((sql_nvp<hiberlite::bean_ptr<B>_> *)&local_100);
    lVar4 = lVar4 + 8;
  }
  AVisitor<hiberlite::KillChildren>::popScope(local_1e8);
  local_1d8._vptr_shared_res = (_func_int **)&PTR__shared_res_001bb598;
  local_1d8.res = (pAVar1->rootKey).con.res;
  if (local_1d8.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_1d8.res)->refCount = (local_1d8.res)->refCount + 1;
  }
  std::__cxx11::string::string((string *)&local_160,local_1a0);
  std::__cxx11::string::string((string *)&local_180,"hiberlite_parent_id",(allocator *)&local_100);
  plVar2 = (local_1f0->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (plVar2 == (local_1f0->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    plVar2 = (local_1f0->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Database::dbDeleteRows<long_long>(&local_1d8,&local_160,&local_180,plVar2[-1]);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_160);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_1d8);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base(&local_1b8);
  std::__cxx11::string::~string(local_1a0);
  return;
}

Assistant:

void KillChildren::act(AV& av, collection_nvp<E,S> nvp )
{
	av.diveTable(nvp.name);
		std::string tab=av.getScope().table();
		std::vector<sqlid_t> children=Database::dbSelectChildIds(av.getConnection(), tab, rowId.top());
		for(size_t i=0;i<children.size();i++){
			E* entry;
			construct(av,&entry,static_cast<unsigned int>(0));
				rowId.push(children[i]);
					sql_nvp<E> el("item",*entry);
					av & el;
				rowId.pop();
			destroy(*this, entry, static_cast<unsigned int>(0));
		}
	av.pop();

	Database::dbDeleteRows(av.getConnection(),tab,HIBERLITE_PARENTID_COLUMN,rowId.top());
}